

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FieldMask::ByteSizeLong(FieldMask *this)

{
  uint uVar1;
  Type *value;
  size_t sVar2;
  int index;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (this->paths_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = (size_t)uVar1;
  uVar3 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar3 = sVar4;
    index = 0;
  }
  for (; (int)uVar3 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->paths_).super_RepeatedPtrFieldBase,index);
    sVar2 = internal::WireFormatLite::StringSize(value);
    sVar4 = sVar4 + sVar2;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar4;
    return sVar4;
  }
  sVar4 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar4,
                     &this->_cached_size_);
  return sVar4;
}

Assistant:

size_t FieldMask::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldMask)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string paths = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(paths_.size());
  for (int i = 0, n = paths_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      paths_.Get(i));
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}